

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

char * __thiscall
gl4cts::GPUShaderFP64Test1::getUniformNameForLocation(GPUShaderFP64Test1 *this,GLint location)

{
  char *pcVar1;
  
  if (this->m_po_bool_arr_uniform_location == location) {
    return "uniform_bool_arr";
  }
  if (this->m_po_bool_uniform_location == location) {
    return "uniform_bool";
  }
  if (this->m_po_bvec2_arr_uniform_location == location) {
    return "uniform_bvec2_arr";
  }
  if (this->m_po_bvec2_uniform_location == location) {
    return "uniform_bvec2";
  }
  if (this->m_po_bvec3_arr_uniform_location == location) {
    return "uniform_bvec3_arr";
  }
  if (this->m_po_bvec3_uniform_location == location) {
    return "uniform_bvec3";
  }
  if (this->m_po_bvec4_arr_uniform_location == location) {
    return "uniform_bvec4_arr";
  }
  if (this->m_po_bvec4_uniform_location == location) {
    return "uniform_bvec4";
  }
  if (this->m_po_dmat2_arr_uniform_location == location) {
    return "uniform_dmat2_arr";
  }
  if (this->m_po_dmat2_uniform_location == location) {
    return "uniform_dmat2";
  }
  if (this->m_po_dmat2x3_arr_uniform_location == location) {
    return "uniform_dmat2x3_arr";
  }
  if (this->m_po_dmat2x3_uniform_location == location) {
    return "uniform_dmat2x3";
  }
  if (this->m_po_dmat2x4_arr_uniform_location == location) {
    return "uniform_dmat2x4_arr";
  }
  if (this->m_po_dmat2x4_uniform_location == location) {
    return "uniform_dmat2x4";
  }
  if (this->m_po_dmat3_arr_uniform_location == location) {
    return "uniform_dmat3_arr";
  }
  if (this->m_po_dmat3_uniform_location == location) {
    return "uniform_dmat3";
  }
  if (this->m_po_dmat3x2_arr_uniform_location == location) {
    return "uniform_dmat3x2_arr";
  }
  if (this->m_po_dmat3x2_uniform_location == location) {
    return "uniform_dmat3x2";
  }
  if (this->m_po_dmat3x4_arr_uniform_location == location) {
    return "uniform_dmat3x4_arr";
  }
  if (this->m_po_dmat3x4_uniform_location == location) {
    return "uniform_dmat3x4";
  }
  if (this->m_po_dmat4_arr_uniform_location == location) {
    return "uniform_dmat4_arr";
  }
  if (this->m_po_dmat4_uniform_location == location) {
    return "uniform_dmat4";
  }
  if (this->m_po_dmat4x2_arr_uniform_location == location) {
    return "uniform_dmat4x2_arr";
  }
  if (this->m_po_dmat4x2_uniform_location == location) {
    return "uniform_dmat4x2";
  }
  if (this->m_po_dmat4x3_arr_uniform_location == location) {
    return "uniform_dmat4x3_arr";
  }
  if (this->m_po_dmat4x3_uniform_location == location) {
    return "uniform_dmat4x3";
  }
  if (this->m_po_double_arr_uniform_location == location) {
    return "uniform_double_arr";
  }
  if (this->m_po_double_uniform_location == location) {
    return "uniform_double";
  }
  if (this->m_po_dvec2_arr_uniform_location == location) {
    return "uniform_dvec2_arr";
  }
  if (this->m_po_dvec2_uniform_location == location) {
    return "uniform_dvec2";
  }
  if (this->m_po_dvec3_arr_uniform_location == location) {
    return "uniform_dvec3_arr";
  }
  if (this->m_po_dvec3_uniform_location == location) {
    return "uniform_dvec3";
  }
  if (this->m_po_dvec4_arr_uniform_location == location) {
    return "uniform_dvec4_arr";
  }
  if (this->m_po_dvec4_uniform_location == location) {
    return "uniform_dvec4";
  }
  if (this->m_po_float_arr_uniform_location == location) {
    return "uniform_float_arr";
  }
  if (this->m_po_float_uniform_location == location) {
    return "uniform_float";
  }
  if (this->m_po_int_arr_uniform_location == location) {
    return "uniform_int_arr";
  }
  if (this->m_po_int_uniform_location == location) {
    return "uniform_int";
  }
  if (this->m_po_ivec2_arr_uniform_location == location) {
    return "uniform_ivec2_arr";
  }
  if (this->m_po_ivec2_uniform_location == location) {
    return "uniform_ivec2";
  }
  if (this->m_po_ivec3_arr_uniform_location == location) {
    return "uniform_ivec3_arr";
  }
  if (this->m_po_ivec3_uniform_location == location) {
    return "uniform_ivec3";
  }
  if (this->m_po_ivec4_arr_uniform_location == location) {
    return "uniform_ivec4_arr";
  }
  if (this->m_po_ivec4_uniform_location == location) {
    return "uniform_ivec4";
  }
  if (this->m_po_uint_arr_uniform_location == location) {
    return "uniform_uint_arr";
  }
  if (this->m_po_uint_uniform_location == location) {
    return "uniform_uint";
  }
  if (this->m_po_uvec2_arr_uniform_location == location) {
    return "uniform_uvec2_arr";
  }
  if (this->m_po_uvec2_uniform_location == location) {
    return "uniform_uvec2";
  }
  if (this->m_po_uvec3_arr_uniform_location == location) {
    return "uniform_uvec3_arr";
  }
  if (this->m_po_uvec3_uniform_location == location) {
    return "uniform_uvec3";
  }
  if (this->m_po_uvec4_arr_uniform_location == location) {
    return "uniform_uvec4_arr";
  }
  if (this->m_po_uvec4_uniform_location == location) {
    return "uniform_uvec4";
  }
  if (this->m_po_vec2_arr_uniform_location == location) {
    return "uniform_vec2_arr";
  }
  if (this->m_po_vec2_uniform_location == location) {
    return "uniform_vec2";
  }
  if (this->m_po_vec3_arr_uniform_location == location) {
    return "uniform_vec3_arr";
  }
  if (this->m_po_vec3_uniform_location == location) {
    return "uniform_vec3";
  }
  if (this->m_po_vec4_arr_uniform_location == location) {
    return "uniform_vec4_arr";
  }
  pcVar1 = "[?]";
  if (this->m_po_vec4_uniform_location == location) {
    pcVar1 = "uniform_vec4";
  }
  return pcVar1;
}

Assistant:

const char* GPUShaderFP64Test1::getUniformNameForLocation(glw::GLint location)
{
	const char* result = "[?]";

	if (location == m_po_bool_arr_uniform_location)
		result = "uniform_bool_arr";
	else if (location == m_po_bool_uniform_location)
		result = "uniform_bool";
	else if (location == m_po_bvec2_arr_uniform_location)
		result = "uniform_bvec2_arr";
	else if (location == m_po_bvec2_uniform_location)
		result = "uniform_bvec2";
	else if (location == m_po_bvec3_arr_uniform_location)
		result = "uniform_bvec3_arr";
	else if (location == m_po_bvec3_uniform_location)
		result = "uniform_bvec3";
	else if (location == m_po_bvec4_arr_uniform_location)
		result = "uniform_bvec4_arr";
	else if (location == m_po_bvec4_uniform_location)
		result = "uniform_bvec4";
	else if (location == m_po_dmat2_arr_uniform_location)
		result = "uniform_dmat2_arr";
	else if (location == m_po_dmat2_uniform_location)
		result = "uniform_dmat2";
	else if (location == m_po_dmat2x3_arr_uniform_location)
		result = "uniform_dmat2x3_arr";
	else if (location == m_po_dmat2x3_uniform_location)
		result = "uniform_dmat2x3";
	else if (location == m_po_dmat2x4_arr_uniform_location)
		result = "uniform_dmat2x4_arr";
	else if (location == m_po_dmat2x4_uniform_location)
		result = "uniform_dmat2x4";
	else if (location == m_po_dmat3_arr_uniform_location)
		result = "uniform_dmat3_arr";
	else if (location == m_po_dmat3_uniform_location)
		result = "uniform_dmat3";
	else if (location == m_po_dmat3x2_arr_uniform_location)
		result = "uniform_dmat3x2_arr";
	else if (location == m_po_dmat3x2_uniform_location)
		result = "uniform_dmat3x2";
	else if (location == m_po_dmat3x4_arr_uniform_location)
		result = "uniform_dmat3x4_arr";
	else if (location == m_po_dmat3x4_uniform_location)
		result = "uniform_dmat3x4";
	else if (location == m_po_dmat4_arr_uniform_location)
		result = "uniform_dmat4_arr";
	else if (location == m_po_dmat4_uniform_location)
		result = "uniform_dmat4";
	else if (location == m_po_dmat4x2_arr_uniform_location)
		result = "uniform_dmat4x2_arr";
	else if (location == m_po_dmat4x2_uniform_location)
		result = "uniform_dmat4x2";
	else if (location == m_po_dmat4x3_arr_uniform_location)
		result = "uniform_dmat4x3_arr";
	else if (location == m_po_dmat4x3_uniform_location)
		result = "uniform_dmat4x3";
	else if (location == m_po_double_arr_uniform_location)
		result = "uniform_double_arr";
	else if (location == m_po_double_uniform_location)
		result = "uniform_double";
	else if (location == m_po_dvec2_arr_uniform_location)
		result = "uniform_dvec2_arr";
	else if (location == m_po_dvec2_uniform_location)
		result = "uniform_dvec2";
	else if (location == m_po_dvec3_arr_uniform_location)
		result = "uniform_dvec3_arr";
	else if (location == m_po_dvec3_uniform_location)
		result = "uniform_dvec3";
	else if (location == m_po_dvec4_arr_uniform_location)
		result = "uniform_dvec4_arr";
	else if (location == m_po_dvec4_uniform_location)
		result = "uniform_dvec4";
	else if (location == m_po_float_arr_uniform_location)
		result = "uniform_float_arr";
	else if (location == m_po_float_uniform_location)
		result = "uniform_float";
	else if (location == m_po_int_arr_uniform_location)
		result = "uniform_int_arr";
	else if (location == m_po_int_uniform_location)
		result = "uniform_int";
	else if (location == m_po_ivec2_arr_uniform_location)
		result = "uniform_ivec2_arr";
	else if (location == m_po_ivec2_uniform_location)
		result = "uniform_ivec2";
	else if (location == m_po_ivec3_arr_uniform_location)
		result = "uniform_ivec3_arr";
	else if (location == m_po_ivec3_uniform_location)
		result = "uniform_ivec3";
	else if (location == m_po_ivec4_arr_uniform_location)
		result = "uniform_ivec4_arr";
	else if (location == m_po_ivec4_uniform_location)
		result = "uniform_ivec4";
	else if (location == m_po_uint_arr_uniform_location)
		result = "uniform_uint_arr";
	else if (location == m_po_uint_uniform_location)
		result = "uniform_uint";
	else if (location == m_po_uvec2_arr_uniform_location)
		result = "uniform_uvec2_arr";
	else if (location == m_po_uvec2_uniform_location)
		result = "uniform_uvec2";
	else if (location == m_po_uvec3_arr_uniform_location)
		result = "uniform_uvec3_arr";
	else if (location == m_po_uvec3_uniform_location)
		result = "uniform_uvec3";
	else if (location == m_po_uvec4_arr_uniform_location)
		result = "uniform_uvec4_arr";
	else if (location == m_po_uvec4_uniform_location)
		result = "uniform_uvec4";
	else if (location == m_po_vec2_arr_uniform_location)
		result = "uniform_vec2_arr";
	else if (location == m_po_vec2_uniform_location)
		result = "uniform_vec2";
	else if (location == m_po_vec3_arr_uniform_location)
		result = "uniform_vec3_arr";
	else if (location == m_po_vec3_uniform_location)
		result = "uniform_vec3";
	else if (location == m_po_vec4_arr_uniform_location)
		result = "uniform_vec4_arr";
	else if (location == m_po_vec4_uniform_location)
		result = "uniform_vec4";

	return result;
}